

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> *
__thiscall
Catch::Clara::Opt::getHelpColumns
          (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           *__return_storage_ptr__,Opt *this)

{
  pointer pbVar1;
  pointer pcVar2;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *pvVar3;
  ostream *poVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  pointer pbVar6;
  initializer_list<Catch::Clara::Detail::HelpColumns> __l;
  ostringstream oss;
  allocator_type local_1f1;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *local_1f0;
  undefined1 local_1e8 [32];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar6 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar1) {
    bVar5 = true;
    do {
      if (bVar5) {
        bVar5 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar1);
  }
  if ((this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," <",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,
                        (this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint._M_dataplus._M_p,
                        (this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint._M_string_length);
    local_1e8[0] = '>';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e8,1);
  }
  std::__cxx11::stringbuf::str();
  pcVar2 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description._M_dataplus._M_p;
  local_1c8._M_p = (pointer)&local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,
             pcVar2 + (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description._M_string_length)
  ;
  pvVar3 = local_1f0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1e8;
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::vector(local_1f0,__l,&local_1f1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT71(local_1e8._1_7_,local_1e8[0]) != local_1e8 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_1e8._1_7_,local_1e8[0]),local_1e8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pvVar3;
}

Assistant:

std::vector<Detail::HelpColumns> Opt::getHelpColumns() const {
            std::ostringstream oss;
            bool first = true;
            for (auto const& opt : m_optNames) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if (!m_hint.empty())
                oss << " <" << m_hint << '>';
            return { { oss.str(), m_description } };
        }